

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O2

void __thiscall Downloader::startDownload(Downloader *this,QUrl *url)

{
  QPushButton *pQVar1;
  QLabel *pQVar2;
  char cVar3;
  uint uVar4;
  QNetworkReply *pQVar5;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_80;
  QNetworkRequest request;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QArrayDataPointer<char16_t> local_38;
  
  QProgressBar::setValue((int)(this->m_ui->super_Ui_Downloader).progressBar);
  pQVar1 = (this->m_ui->super_Ui_Downloader).stopButton;
  tr((QString *)&local_a0,"Stop",(char *)0x0,-1);
  QAbstractButton::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  pQVar2 = (this->m_ui->super_Ui_Downloader).downloadLabel;
  tr((QString *)&local_a0,"Downloading updates",(char *)0x0,-1);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  pQVar2 = (this->m_ui->super_Ui_Downloader).timeLabel;
  tr((QString *)&request,"Time remaining",(char *)0x0,-1);
  operator+((QString *)&local_80,(QString *)&request,": ");
  tr((QString *)&local_38,"unknown",(char *)0x0,-1);
  operator+((QString *)&local_a0,(QString *)&local_80,(QString *)&local_38);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&request);
  QNetworkRequest::QNetworkRequest(&request,url);
  QVariant::QVariant((QVariant *)&local_a0,1);
  QNetworkRequest::setAttribute((Attribute)&request,(QVariant *)0x16);
  QVariant::~QVariant((QVariant *)&local_a0);
  QNetworkRequest::setTransferTimeout((int)&request);
  if ((this->m_userAgentString).d.size != 0) {
    QByteArray::QByteArray((QByteArray *)&local_a0,"User-Agent",-1);
    QString::toUtf8_helper((QString *)&local_80);
    QNetworkRequest::setRawHeader((QByteArray *)&request,(QByteArray *)&local_a0);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_80);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a0);
  }
  pQVar5 = (QNetworkReply *)QNetworkAccessManager::get((QNetworkRequest *)this->m_manager);
  this->m_reply = pQVar5;
  QDateTime::currentDateTime();
  uVar4 = QDateTime::toSecsSinceEpoch();
  this->m_startTime = uVar4;
  QDateTime::~QDateTime((QDateTime *)&local_a0);
  cVar3 = QDir::exists();
  if (cVar3 == '\0') {
    QString::QString((QString *)&local_a0,".");
    QDir::mkpath((QString *)&this->m_downloadDir);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  }
  QDir::filePath((QString *)&local_a0);
  QFile::remove((QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  operator+((QString *)&local_80,&this->m_fileName,&PARTIAL_DOWN);
  QDir::filePath((QString *)&local_a0);
  QFile::remove((QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QObject::connect(local_40,(char *)this->m_reply,(QObject *)"2metaDataChanged()",(char *)this,
                   0x114bbb);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)this->m_reply,(QObject *)"2downloadProgress(qint64, qint64)",
                   (char *)this,0x114bf0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,(char *)this->m_reply,(QObject *)"2finished()",(char *)this,0x114c1c);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QWidget::showNormal();
  QNetworkRequest::~QNetworkRequest(&request);
  return;
}

Assistant:

void Downloader::startDownload(const QUrl &url)
{
   /* Reset UI */
   m_ui->progressBar->setValue(0);
   m_ui->stopButton->setText(tr("Stop"));
   m_ui->downloadLabel->setText(tr("Downloading updates"));
   m_ui->timeLabel->setText(tr("Time remaining") + ": " + tr("unknown"));

   /* Configure the network request */
   QNetworkRequest request(url);

   request.setAttribute(QNetworkRequest::RedirectPolicyAttribute, QNetworkRequest::NoLessSafeRedirectPolicy);
   
#if (QT_VERSION >= QT_VERSION_CHECK(5, 15, 0))
   /* 10s timeout */
   request.setTransferTimeout(10000);
#endif

   if (!m_userAgentString.isEmpty())
      request.setRawHeader("User-Agent", m_userAgentString.toUtf8());

   /* Start download */
   m_reply = m_manager->get(request);
   m_startTime = QDateTime::currentDateTime().toSecsSinceEpoch();

   /* Ensure that downloads directory exists */
   if (!m_downloadDir.exists())
      m_downloadDir.mkpath(".");

   /* Remove old downloads */
   QFile::remove(m_downloadDir.filePath(m_fileName));
   QFile::remove(m_downloadDir.filePath(m_fileName + PARTIAL_DOWN));

   /* Update UI when download progress changes or download finishes */
   connect(m_reply, SIGNAL(metaDataChanged()), this, SLOT(metaDataChanged()));
   connect(m_reply, SIGNAL(downloadProgress(qint64, qint64)), this, SLOT(updateProgress(qint64, qint64)));
   connect(m_reply, SIGNAL(finished()), this, SLOT(finished()));

   showNormal();
}